

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiWindow *this;
  ImGuiTable *pIVar4;
  ImDrawList *draw_list;
  ImGuiContext *pIVar5;
  char *pcVar6;
  bool bVar7;
  ImGuiID id;
  ImU32 IVar8;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar9;
  char *pcVar10;
  float fVar11;
  int iVar12;
  long lVar13;
  ImGuiTableColumn *pIVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  ImVec2 IVar18;
  ImVec2 pos;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  ulong uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  ImRect bb;
  bool local_10a;
  bool local_109;
  ImGuiTableColumn *local_108;
  float local_100;
  char local_fc [4];
  undefined1 local_f8 [16];
  char *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b4;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ImVec2 local_80;
  char *local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  undefined8 extraout_XMM0_Qb_00;
  
  pIVar5 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    pIVar4 = GImGui->CurrentTable;
    iVar12 = pIVar4->CurrentColumn;
    lVar13 = (long)iVar12;
    local_108 = (pIVar4->Columns).Data + lVar13;
    pcVar10 = "";
    if (label != (char *)0x0) {
      pcVar10 = label;
    }
    local_78 = FindRenderedTextEnd(pcVar10,(char *)0x0);
    local_68 = CalcTextSize(pcVar10,local_78,true,-1.0);
    local_a8._0_4_ = local_68.x;
    local_80 = (this->DC).CursorPos;
    pIVar14 = (pIVar4->Columns).Data;
    fVar21 = pIVar14[lVar13].MinX;
    if (pIVar14[lVar13].PrevEnabledColumn == -1) {
      fVar21 = fVar21 - pIVar4->CellSpacingX1;
    }
    local_f8 = ZEXT416((uint)fVar21);
    fVar21 = pIVar14[lVar13].MaxX;
    if (pIVar14[lVar13].NextEnabledColumn == -1) {
      fVar21 = fVar21 + pIVar4->CellSpacingX2;
    }
    local_d8 = ZEXT416((uint)fVar21);
    local_e0._0_4_ = local_80.x;
    local_100 = pIVar4->RowPosY1;
    local_c8 = ZEXT416((uint)pIVar4->RowPosY2);
    fVar21 = pIVar4->RowMinHeight - (pIVar4->CellPaddingY + pIVar4->CellPaddingY);
    uVar16 = -(uint)(fVar21 <= local_68.y);
    local_58 = ZEXT416(uVar16 & (uint)local_68.y | ~uVar16 & (uint)fVar21);
    local_fc[0] = '\0';
    local_fc[1] = '\0';
    local_fc[2] = '\0';
    local_fc[3] = '\0';
    auVar20 = ZEXT816(0);
    pIVar14 = local_108;
    local_70 = local_80;
    if (((pIVar4->Flags & 8) == 0) || ((local_108->Flags & 0x100) != 0)) {
      local_98._0_4_ = 0.0;
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
    }
    else {
      local_98._0_4_ = (undefined4)(int)(pIVar5->FontSize * 0.65 + (pIVar5->Style).FramePadding.x);
      local_98._4_4_ = 0;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
      if ('\0' < local_108->SortOrder) {
        local_98 = ZEXT416((uint)local_98._0_4_);
        local_a8._8_4_ = (int)extraout_XMM0_Qb;
        local_a8._0_4_ = local_68.x;
        local_a8._4_4_ = local_68.y;
        local_a8._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        ImFormatString(local_fc,4,"%d",(ulong)((byte)local_108->SortOrder + 1));
        pIVar14 = local_108;
        local_b4 = (pIVar5->Style).ItemInnerSpacing.x;
        auVar19._0_8_ = CalcTextSize(local_fc,(char *)0x0,false,-1.0);
        auVar19._8_8_ = extraout_XMM0_Qb_00;
        auVar20._4_12_ = auVar19._4_12_;
        auVar20._0_4_ = auVar19._0_4_ + local_b4;
      }
    }
    fVar21 = (float)local_a8._0_4_ + local_e0._0_4_ + auVar20._0_4_ + (float)local_98._0_4_;
    uVar2 = pIVar14->ContentMaxXHeadersUsed;
    uVar3 = pIVar14->ContentMaxXHeadersIdeal;
    uVar16 = -(uint)(pIVar14->WorkMaxX <= (float)uVar2);
    uVar17 = -(uint)(fVar21 <= (float)uVar3);
    uVar22 = CONCAT44(~uVar17 & (uint)fVar21,~uVar16 & (uint)pIVar14->WorkMaxX) |
             CONCAT44(uVar3 & uVar17,uVar2 & uVar16);
    pIVar14->ContentMaxXHeadersUsed = (float)(int)uVar22;
    pIVar14->ContentMaxXHeadersIdeal = (float)(int)(uVar22 >> 0x20);
    if ((pIVar4->IsContextPopupOpen == true) && (iVar12 == pIVar4->ContextPopupColumn)) {
      bVar15 = pIVar4->InstanceInteracted == pIVar4->InstanceCurrent;
    }
    else {
      bVar15 = false;
    }
    local_e0 = pcVar10;
    local_b0 = lVar13;
    local_a8 = auVar20;
    id = ImGuiWindow::GetID(this,pcVar10,(char *)0x0);
    fVar21 = (pIVar5->Style).CellPadding.y;
    fVar21 = fVar21 + fVar21 + local_100 + (float)local_58._0_4_;
    uVar16 = -(uint)(fVar21 <= (float)local_c8._0_4_);
    local_40.Max.y = (float)(uVar16 & local_c8._0_4_ | ~uVar16 & (uint)fVar21);
    local_40.Min.x = (float)local_f8._0_4_;
    local_40.Min.y = local_100;
    local_40.Max.x = (float)local_d8._0_4_;
    local_60.x = 0.0;
    local_60.y = (float)local_58._0_4_;
    ItemSize(&local_60,-1.0);
    bVar7 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar7) {
      bVar7 = ButtonBehavior(&local_40,id,&local_109,&local_10a,0x1000);
      local_100 = (float)CONCAT31(local_100._1_3_,bVar7);
      if (pIVar5->ActiveId != id) {
        SetItemAllowOverlap();
      }
      IVar18 = local_80;
      pcVar10 = local_e0;
      pIVar14 = local_108;
      if (((local_10a | local_109) & 1U) == 0 && !bVar15) {
        iVar12 = (int)local_b0;
        if ((pIVar4->field_0x90 & 1) == 0) {
          IVar8 = GetColorU32(0x2a,1.0);
          TableSetBgColor(3,IVar8,pIVar4->CurrentColumn);
          pIVar14 = local_108;
        }
      }
      else {
        uVar17 = local_109 & 1 | 0x18;
        uVar16 = 0x1a;
        if (local_10a == false) {
          uVar16 = uVar17;
        }
        IVar8 = GetColorU32(uVar16,1.0);
        TableSetBgColor(3,IVar8,pIVar4->CurrentColumn);
        RenderNavHighlight((ImGui *)&local_40,(ImRect *)(ulong)id,10,uVar17);
        iVar12 = (int)local_b0;
        pcVar10 = local_e0;
      }
      if (local_10a == false) {
        (this->DC).CursorPos.y = (pIVar5->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
      }
      else {
        pIVar4->HeldHeaderColumn = (ImGuiTableColumnIdx)iVar12;
        (this->DC).CursorPos.y = (pIVar5->Style).ItemSpacing.y * -0.5 + (this->DC).CursorPos.y;
        if ((pIVar4->Flags & 2) != 0) {
          bVar15 = IsMouseDragging(0,-1.0);
          pIVar14 = local_108;
          if ((bVar15) && (pIVar5->DragDropActive == false)) {
            pIVar4->ReorderColumn = (ImGuiTableColumnIdx)iVar12;
            pIVar4->InstanceInteracted = pIVar4->InstanceCurrent;
            fVar21 = (pIVar5->IO).MouseDelta.x;
            if (((fVar21 < 0.0) &&
                (((pIVar1 = &(pIVar5->IO).MousePos,
                  pIVar1->x <= (float)local_f8._0_4_ && (float)local_f8._0_4_ != pIVar1->x &&
                  ((long)local_108->PrevEnabledColumn != -1)) &&
                 (pIVar9 = (pIVar4->Columns).Data, pIVar9 != (ImGuiTableColumn *)0x0)))) &&
               ((pIVar9 = pIVar9 + local_108->PrevEnabledColumn,
                ((pIVar9->Flags | local_108->Flags) & 0x20U) == 0 &&
                (local_108->IndexWithinEnabledSet < pIVar4->FreezeColumnsRequest !=
                 pIVar4->FreezeColumnsRequest <= pIVar9->IndexWithinEnabledSet)))) {
              pIVar4->ReorderColumnDir = -1;
            }
            if (((0.0 < fVar21) && ((float)local_d8._0_4_ < (pIVar5->IO).MousePos.x)) &&
               (((long)local_108->NextEnabledColumn != -1 &&
                (((pIVar9 = (pIVar4->Columns).Data, pIVar9 != (ImGuiTableColumn *)0x0 &&
                  (pIVar9 = pIVar9 + local_108->NextEnabledColumn,
                  ((pIVar9->Flags | local_108->Flags) & 0x20U) == 0)) &&
                 (local_108->IndexWithinEnabledSet < pIVar4->FreezeColumnsRequest !=
                  pIVar4->FreezeColumnsRequest <= pIVar9->IndexWithinEnabledSet)))))) {
              pIVar4->ReorderColumnDir = '\x01';
            }
          }
        }
      }
      fVar11 = IVar18.y;
      local_d8._0_4_ = ((float)local_d8._0_4_ - (float)local_98._0_4_) - (float)local_a8._0_4_;
      fVar21 = (float)local_d8._0_4_;
      if (((pIVar4->Flags & 8) != 0) && ((pIVar14->Flags & 0x100) == 0)) {
        uVar23 = 0;
        uVar24 = 0;
        uVar25 = 0;
        if (pIVar14->SortOrder != -1) {
          local_c8 = ZEXT416((uint)fVar11);
          local_f8._4_4_ = local_f8._4_4_ & local_d8._4_4_;
          local_f8._0_4_ =
               ~-(uint)((float)local_d8._0_4_ <= (float)local_f8._0_4_) & local_d8._0_4_ |
               local_f8._0_4_ & -(uint)((float)local_d8._0_4_ <= (float)local_f8._0_4_);
          local_f8._8_4_ = local_f8._8_4_ & local_d8._8_4_;
          local_f8._12_4_ = local_f8._12_4_ & local_d8._12_4_;
          if ('\0' < pIVar14->SortOrder) {
            IVar8 = GetColorU32(0,0.7);
            PushStyleColor(0,IVar8);
            IVar18.x = (pIVar5->Style).ItemInnerSpacing.x + (float)local_f8._0_4_;
            IVar18.y = (float)local_c8._0_4_;
            RenderText(IVar18,local_fc,(char *)0x0,true);
            PopStyleColor(1);
            local_f8._0_4_ = (float)local_f8._0_4_ + (float)local_a8._0_4_;
          }
          draw_list = this->DrawList;
          IVar8 = GetColorU32(0,1.0);
          pIVar14 = local_108;
          pos.y = (float)local_c8._0_4_;
          pos.x = (float)local_f8._0_4_;
          RenderArrow(draw_list,pos,IVar8,(local_108->field_0x64 & 3) == 1 ^ 3,0.65);
          fVar21 = (float)local_d8._0_4_;
          fVar11 = (float)local_c8._0_4_;
          uVar23 = local_c8._4_4_;
          uVar24 = local_c8._8_4_;
          uVar25 = local_c8._12_4_;
        }
        if ((local_100._0_1_ != '\0') && (iVar12 != pIVar4->ReorderColumn)) {
          local_c8._4_4_ = uVar23;
          local_c8._0_4_ = fVar11;
          local_c8._8_4_ = uVar24;
          local_c8._12_4_ = uVar25;
          sort_direction = TableGetColumnNextSortDirection(pIVar14);
          TableSetColumnSortDirection(iVar12,sort_direction,(pIVar5->IO).KeyShift);
          fVar21 = (float)local_d8._0_4_;
          fVar11 = (float)local_c8._0_4_;
        }
      }
      pcVar6 = local_78;
      local_60.y = (float)local_58._0_4_ + fVar11 + (pIVar5->Style).FramePadding.y;
      local_60.x = fVar21;
      RenderTextEllipsis(this->DrawList,&local_70,&local_60,fVar21,fVar21,pcVar10,local_78,&local_68
                        );
      if ((((float)local_d8._0_4_ - local_70.x < local_68.x) && (local_109 == true)) &&
         (pIVar5->TooltipSlowDelay <= pIVar5->HoveredIdNotActiveTimer &&
          pIVar5->HoveredIdNotActiveTimer != pIVar5->TooltipSlowDelay)) {
        SetTooltip("%.*s",(ulong)(uint)((int)pcVar6 - (int)pcVar10),pcVar10);
      }
      bVar15 = IsMouseReleased(1);
      if (bVar15) {
        bVar15 = IsItemHovered(0);
        if (bVar15) {
          TableOpenContextMenu(iVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
        RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}